

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SwapExtension
          (ExtensionSet *this,MessageLite *extendee,ExtensionSet *other,int number)

{
  Arena *pAVar1;
  Arena *pAVar2;
  KeyValue *other_extension;
  AllocatedData AVar3;
  Extension *other_extension_00;
  Extension *temp_ext;
  undefined1 local_50 [8];
  ExtensionSet temp;
  Extension *other_ext;
  Extension *this_ext;
  int number_local;
  ExtensionSet *other_local;
  MessageLite *extendee_local;
  ExtensionSet *this_local;
  
  if (this != other) {
    pAVar1 = GetArena(this);
    pAVar2 = GetArena(other);
    if (pAVar1 == pAVar2) {
      UnsafeShallowSwapExtension(this,other,number);
    }
    else {
      other_extension = (KeyValue *)FindOrNull(this,number);
      AVar3.flat = (KeyValue *)FindOrNull(other,number);
      if (other_extension != AVar3.flat) {
        temp.map_.flat = AVar3.flat;
        if ((other_extension == (KeyValue *)0x0) || (AVar3.flat == (KeyValue *)0x0)) {
          if (other_extension == (KeyValue *)0x0) {
            pAVar1 = GetArena(other);
            InternalExtensionMergeFrom(this,extendee,number,(Extension *)AVar3.flat,pAVar1);
            pAVar1 = GetArena(other);
            if (pAVar1 == (Arena *)0x0) {
              Extension::Free((Extension *)temp.map_.flat);
            }
            Erase(other,number);
          }
          else {
            pAVar1 = GetArena(this);
            InternalExtensionMergeFrom(other,extendee,number,(Extension *)other_extension,pAVar1);
            pAVar1 = GetArena(this);
            if (pAVar1 == (Arena *)0x0) {
              Extension::Free((Extension *)other_extension);
            }
            Erase(this,number);
          }
        }
        else {
          ExtensionSet((ExtensionSet *)local_50);
          AVar3 = temp.map_;
          pAVar1 = GetArena(other);
          InternalExtensionMergeFrom
                    ((ExtensionSet *)local_50,extendee,number,(Extension *)AVar3.flat,pAVar1);
          other_extension_00 = FindOrNull((ExtensionSet *)local_50,number);
          Extension::Clear((Extension *)temp.map_.flat);
          pAVar1 = GetArena(this);
          InternalExtensionMergeFrom(other,extendee,number,(Extension *)other_extension,pAVar1);
          Extension::Clear((Extension *)other_extension);
          pAVar1 = GetArena((ExtensionSet *)local_50);
          InternalExtensionMergeFrom(this,extendee,number,other_extension_00,pAVar1);
          ~ExtensionSet((ExtensionSet *)local_50);
        }
      }
    }
  }
  return;
}

Assistant:

void ExtensionSet::SwapExtension(const MessageLite* extendee,
                                 ExtensionSet* other, int number) {
  if (this == other) return;

  if (GetArena() == other->GetArena()) {
    UnsafeShallowSwapExtension(other, number);
    return;
  }

  Extension* this_ext = FindOrNull(number);
  Extension* other_ext = other->FindOrNull(number);

  if (this_ext == other_ext) return;

  if (this_ext != nullptr && other_ext != nullptr) {
    // TODO(cfallin, rohananil): We could further optimize these cases,
    // especially avoid creation of ExtensionSet, and move MergeFrom logic
    // into Extensions itself (which takes arena as an argument).
    // We do it this way to reuse the copy-across-arenas logic already
    // implemented in ExtensionSet's MergeFrom.
    ExtensionSet temp;
    temp.InternalExtensionMergeFrom(extendee, number, *other_ext,
                                    other->GetArena());
    Extension* temp_ext = temp.FindOrNull(number);

    other_ext->Clear();
    other->InternalExtensionMergeFrom(extendee, number, *this_ext,
                                      this->GetArena());
    this_ext->Clear();
    InternalExtensionMergeFrom(extendee, number, *temp_ext, temp.GetArena());
  } else if (this_ext == nullptr) {
    InternalExtensionMergeFrom(extendee, number, *other_ext, other->GetArena());
    if (other->GetArena() == nullptr) other_ext->Free();
    other->Erase(number);
  } else {
    other->InternalExtensionMergeFrom(extendee, number, *this_ext,
                                      this->GetArena());
    if (GetArena() == nullptr) this_ext->Free();
    Erase(number);
  }
}